

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O3

void computeParentHash(tree_t *tree,uint child,uint8_t *salt,picnic_instance_t *params)

{
  uint uVar1;
  uint uVar2;
  bitset_word_t *pbVar3;
  uint uVar4;
  uint uVar5;
  uint rate;
  uint uVar6;
  uint16_t data_le;
  hash_context ctx;
  undefined2 local_12a;
  picnic_instance_t *local_128;
  ulong local_120;
  ulong local_118;
  Keccak_HashInstance local_110;
  
  if ((child < tree->numNodes) &&
     (pbVar3 = tree->haveNodeExists,
     (pbVar3[child * 2 >> 6] >> ((ulong)(child * 2) & 0x3f) & 1) != 0)) {
    uVar6 = child + 1 >> 1;
    uVar1 = uVar6 * 2 - 2;
    uVar2 = uVar6 * 2 - 1;
    uVar4 = uVar1 >> 6;
    if (((pbVar3[uVar4] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
       (((pbVar3[uVar2 * 2 >> 6] >> ((ulong)(byte)((char)(uVar2 * 2) + 1) & 0x3f) & 1) != 0 &&
        (uVar5 = uVar1 * 2 + 4, ((uint)(pbVar3[uVar5 >> 6] >> ((byte)uVar5 & 0x3c)) & 3) != 1)))) {
      local_120 = (ulong)(uVar6 * 2);
      uVar6 = uVar6 - 1;
      local_12a = CONCAT11(local_12a._1_1_,3);
      if (params->digest_size == ' ') {
        rate = 0x540;
        uVar5 = 0x100;
      }
      else {
        rate = 0x440;
        uVar5 = 0x200;
      }
      local_128 = params;
      Keccak_HashInitialize(&local_110,rate,uVar5,0,'\x1f');
      local_118 = 1L << ((ulong)uVar2 & 0x3f);
      Keccak_HashUpdate(&local_110,(BitSequence *)&local_12a,8);
      Keccak_HashUpdate(&local_110,tree->nodes + uVar2 * local_128->digest_size,
                        (ulong)local_128->digest_size << 3);
      if ((uVar6 < tree->numNodes && (uint)local_120 < tree->numNodes) &&
         ((tree->haveNodeExists[uVar4] >> (uVar1 & 0x3e) & 1) != 0)) {
        Keccak_HashUpdate(&local_110,tree->nodes + (uint)local_120 * (uint)local_128->digest_size,
                          (ulong)local_128->digest_size << 3);
      }
      Keccak_HashUpdate(&local_110,salt,0x100);
      local_12a = (undefined2)uVar6;
      Keccak_HashUpdate(&local_110,(BitSequence *)&local_12a,0x10);
      Keccak_HashFinal(&local_110,(BitSequence *)0x0);
      Keccak_HashSqueeze(&local_110,tree->nodes + uVar6 * local_128->digest_size,
                         (ulong)local_128->digest_size << 3);
      tree->haveNodeExists[uVar4] = tree->haveNodeExists[uVar4] | local_118;
    }
  }
  return;
}

Assistant:

static void computeParentHash(tree_t* tree, unsigned int child, uint8_t* salt,
                              const picnic_instance_t* params) {
  if (!exists(tree, child)) {
    return;
  }

  unsigned int parent = getParent(child);
  if (haveNode(tree, parent)) {
    return;
  }

  /* Compute the hash for parent, if we have everything */
  if (!haveNode(tree, 2 * parent + 1)) {
    return;
  }

  if (existsNotHaveNode(tree, 2 * parent + 2)) {
    return;
  }

  /* Compute parent data = H(left child data || [right child data] || salt || parent idx) */
  hash_context ctx;

  hash_init_prefix(&ctx, params->digest_size, HASH_PREFIX_3);
  hash_update(&ctx, &tree->nodes[(2 * parent + 1) * params->digest_size], params->digest_size);
  if (hasRightChild(tree, parent)) {
    /* One node may not have a right child when there's an odd number of leaves */
    hash_update(&ctx, &tree->nodes[(2 * parent + 2) * params->digest_size], params->digest_size);
  }

  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, parent);
  hash_final(&ctx);
  hash_squeeze(&ctx, &tree->nodes[parent * params->digest_size], params->digest_size);
  hash_clear(&ctx);
  markNode(tree, parent);
}